

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_auth.cc
# Opt level: O3

void __thiscall
prometheus::BasicAuthHandler::BasicAuthHandler
          (BasicAuthHandler *this,AuthFunc *callback,string *realm)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->super_CivetAuthHandler)._vptr_CivetAuthHandler =
       (_func_int **)&PTR__BasicAuthHandler_0013bb00;
  *(undefined8 *)&(this->callback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->callback_).super__Function_base._M_functor + 8) = 0;
  (this->callback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->callback_)._M_invoker = callback->_M_invoker;
  if ((callback->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar4 = *(undefined8 *)((long)&(callback->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->callback_).super__Function_base._M_functor =
         *(undefined8 *)&(callback->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->callback_).super__Function_base._M_functor + 8) = uVar4;
    (this->callback_).super__Function_base._M_manager = (callback->super__Function_base)._M_manager;
    (callback->super__Function_base)._M_manager = (_Manager_type)0x0;
    callback->_M_invoker = (_Invoker_type)0x0;
  }
  paVar1 = &(this->realm_).field_2;
  (this->realm_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (realm->_M_dataplus)._M_p;
  paVar2 = &realm->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&realm->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->realm_).field_2 + 8) = uVar4;
  }
  else {
    (this->realm_)._M_dataplus._M_p = pcVar3;
    (this->realm_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->realm_)._M_string_length = realm->_M_string_length;
  (realm->_M_dataplus)._M_p = (pointer)paVar2;
  realm->_M_string_length = 0;
  (realm->field_2)._M_local_buf[0] = '\0';
  return;
}

Assistant:

BasicAuthHandler::BasicAuthHandler(AuthFunc callback, std::string realm)
    : callback_(std::move(callback)), realm_(std::move(realm)) {}